

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O1

void __thiscall UDUNITS_acceptedNameSymbols_Test::TestBody(UDUNITS_acceptedNameSymbols_Test *this)

{
  char cVar1;
  bool bVar2;
  XMLError XVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  uint64_t uVar7;
  ulong uVar8;
  ostream *poVar9;
  size_t sVar10;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  undefined4 uVar11;
  float fVar12;
  undefined4 uVar13;
  precise_unit pVar14;
  int failConvert;
  AssertionResult gtest_ar_;
  string def;
  XMLDocument doc;
  unit local_3f0;
  AssertHelper local_3e8;
  unit local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  undefined1 local_3d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  double local_3b0;
  string local_3a8;
  double local_388;
  XMLElement *local_380;
  string local_378;
  string local_358;
  XMLDocument local_338;
  
  tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile
                    (&local_338,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UDUNITS2/udunits2-accepted.xml"
                    );
  local_3e0.multiplier_._0_1_ = XVar3 == XML_SUCCESS;
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (XVar3 == XML_SUCCESS) {
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&local_338.super_XMLNode,"unit-system");
    pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"unit");
    local_3e8.data_._0_4_ = 0;
    if (pXVar4 != (XMLElement *)0x0) {
      do {
        pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"def");
        pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
        std::__cxx11::string::string((string *)local_3d0,pcVar6,(allocator *)&local_3e0);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,CONCAT71(local_3d0._1_7_,local_3d0[0]),
                   (long)&(local_3c8->_M_dataplus)._M_p + CONCAT71(local_3d0._1_7_,local_3d0[0]));
        uVar7 = units::getDefaultFlags();
        pVar14 = units::unit_from_string(&local_3a8,uVar7);
        uVar8 = pVar14._8_8_;
        local_3b0 = pVar14.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        local_380 = pXVar4;
        if ((uVar8 & 0xffffffff) == 0xfa94a488 || NAN(local_3b0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"unable to convert ",0x12);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)CONCAT71(local_3d0._1_7_,local_3d0[0]),
                              (long)local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," into a valid unit \n",0x14);
          local_3e8.data_._0_4_ = (int)local_3e8.data_ + 1;
        }
        else {
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"name");
          if (pXVar5 != (XMLElement *)0x0) {
            pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"singular");
            pcVar6 = tinyxml2::XMLNode::Value((pXVar5->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_378,pcVar6,(allocator *)&local_3e0);
            uVar7 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_378,uVar7);
            uVar11 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              local_388 = pVar14.multiplier_;
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
              uVar11 = SUB84(local_388,0);
              uVar13 = (undefined4)((ulong)local_388 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar11)) || NAN((double)CONCAT44(uVar13,uVar11)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit \n",0x14);
            }
            else {
              local_3e0 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar11) |
                                pVar14._8_8_ << 0x20);
              local_3f0 = (unit)((ulong)(uint)(float)local_3b0 | uVar8 << 0x20);
              bVar2 = units::unit::operator==(&local_3e0,&local_3f0);
              if (bVar2) goto LAB_00129b84;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"name and unit do not match ",0x1b);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,
                                  (char *)CONCAT71(local_3d0._1_7_,local_3d0[0]),(long)local_3c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            local_3e8.data_._0_4_ = (int)local_3e8.data_ + 1;
          }
LAB_00129b84:
          pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"symbol");
          fVar12 = (float)local_3b0;
          for (; pXVar4 != (XMLElement *)0x0;
              pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"symbol")) {
            pcVar6 = tinyxml2::XMLNode::Value((pXVar4->super_XMLNode)._firstChild);
            std::__cxx11::string::string((string *)&local_358,pcVar6,(allocator *)&local_3e0);
            uVar7 = units::getDefaultFlags();
            pVar14 = units::unit_from_string(&local_358,uVar7);
            uVar11 = pVar14.multiplier_._0_4_;
            uVar13 = pVar14.multiplier_._4_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              local_3b0 = pVar14.multiplier_;
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar11 = SUB84(local_3b0,0);
              uVar13 = (undefined4)((ulong)local_3b0 >> 0x20);
            }
            if ((pVar14._8_8_ & 0xffffffff) == 0xfa94a488 ||
                (NAN((double)CONCAT44(uVar13,uVar11)) || NAN((double)CONCAT44(uVar13,uVar11)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"unable to convert ",0x12);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
              }
              else {
                sVar10 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar6,sVar10);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," into a valid unit \n",0x14);
LAB_00129d42:
              local_3e8.data_._0_4_ = (int)local_3e8.data_ + 1;
            }
            else {
              local_3e0 = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar13,uVar11) |
                                pVar14._8_8_ << 0x20);
              local_3f0 = (unit)((ulong)(uint)fVar12 | uVar8 << 0x20);
              bVar2 = units::unit::operator==(&local_3e0,&local_3f0);
              if (!bVar2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"symbol and unit do not match ",0x1d);
                if (pcVar6 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c0430);
                }
                else {
                  sVar10 = strlen(pcVar6);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar6,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_3d0._1_7_,local_3d0[0]),(long)local_3c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                goto LAB_00129d42;
              }
            }
          }
        }
        pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&local_380->super_XMLNode,"unit");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3d0._1_7_,local_3d0[0]) != &local_3c0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3d0._1_7_,local_3d0[0]),
                          local_3c0._M_allocated_capacity + 1);
        }
      } while (pXVar4 != (XMLElement *)0x0);
    }
    local_3e0 = (unit)((ulong)local_3e0 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_3d0,"failConvert","0",(int *)&local_3e8,(int *)&local_3e0);
    if (local_3d0[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_3e0);
      if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_3c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
                 ,0x48,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3f0,(Message *)&local_3e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3f0);
      if (local_3e0 != (unit)0x0) {
        (**(code **)(*(long *)local_3e0 + 8))();
      }
    }
    if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129e05;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3c8;
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3d8;
    testing::Message::Message((Message *)&local_3f0);
    std::ostream::operator<<((ostream *)((long)local_3f0 + 0x10),XVar3);
    cVar1 = local_3f0.multiplier_._0_1_ + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(long *)((long)local_3f0 + 0x10) + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3d0,(internal *)&local_3e0,(AssertionResult *)0x180888,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_udunits.cpp"
               ,0x17,(char *)CONCAT71(local_3d0._1_7_,local_3d0[0]));
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3d0._1_7_,local_3d0[0]) != &local_3c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_3d0._1_7_,local_3d0[0]),local_3c0._M_allocated_capacity + 1)
      ;
    }
    if (local_3f0 != (unit)0x0) {
      (**(code **)(*(long *)local_3f0 + 8))();
    }
    local_3c8 = local_3d8;
    if (local_3d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129e05;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_3c8);
LAB_00129e05:
  tinyxml2::XMLDocument::~XMLDocument(&local_338);
  return;
}

Assistant:

TEST(UDUNITS, acceptedNameSymbols)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-accepted.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string def = cs->FirstChildElement("def")->FirstChild()->Value();

        auto definitionUnit = units::unit_from_string(def);
        if (is_error(definitionUnit)) {
            std::cout << "unable to convert " << def << " into a valid unit \n";
            ++failConvert;
        } else {
            auto name = cs->FirstChildElement("name");
            if (name != nullptr) {
                auto sname =
                    name->FirstChildElement("singular")->FirstChild()->Value();
                auto nameUnit = units::unit_from_string(sname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert " << sname
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            // check for symbols
            auto sym = cs->FirstChildElement("symbol");
            while (sym != nullptr) {
                auto symString = sym->FirstChild()->Value();
                auto symUnit = units::unit_from_string(symString);
                if (is_error(symUnit)) {
                    std::cout << "unable to convert " << symString
                              << " into a valid unit \n";
                    ++failConvert;
                } else {
                    if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                        std::cout << "symbol and unit do not match "
                                  << symString << " and " << def << "\n";
                        ++failConvert;
                    }
                }
                sym = sym->NextSiblingElement("symbol");
            }
        }
        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}